

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void riscv_cpu_set_fflags_riscv32(CPURISCVState_conflict *env,target_ulong_conflict hard)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int soft;
  target_ulong_conflict hard_local;
  CPURISCVState_conflict *env_local;
  
  uVar1 = 0;
  if ((hard & 1) != 0) {
    uVar1 = 0x20;
  }
  uVar2 = 0;
  if ((hard & 2) != 0) {
    uVar2 = 0x10;
  }
  uVar3 = 0;
  if ((hard & 4) != 0) {
    uVar3 = 8;
  }
  uVar4 = 0;
  if ((hard & 8) != 0) {
    uVar4 = 4;
  }
  set_float_exception_flags
            ((uint)((hard & 0x10) != 0) | uVar4 | uVar3 | uVar2 | uVar1,&env->fp_status);
  return;
}

Assistant:

void riscv_cpu_set_fflags(CPURISCVState *env, target_ulong hard)
{
    int soft = 0;

    soft |= (hard & FPEXC_NX) ? float_flag_inexact : 0;
    soft |= (hard & FPEXC_UF) ? float_flag_underflow : 0;
    soft |= (hard & FPEXC_OF) ? float_flag_overflow : 0;
    soft |= (hard & FPEXC_DZ) ? float_flag_divbyzero : 0;
    soft |= (hard & FPEXC_NV) ? float_flag_invalid : 0;

    set_float_exception_flags(soft, &env->fp_status);
}